

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

aom_read_bit_buffer *
av1_init_read_bit_buffer(AV1Decoder *pbi,aom_read_bit_buffer *rb,uint8_t *data,uint8_t *data_end)

{
  uint8_t *data_end_local;
  uint8_t *data_local;
  aom_read_bit_buffer *rb_local;
  AV1Decoder *pbi_local;
  
  rb->bit_offset = 0;
  rb->error_handler = error_handler;
  rb->error_handler_data = &pbi->common;
  rb->bit_buffer = data;
  rb->bit_buffer_end = data_end;
  return rb;
}

Assistant:

struct aom_read_bit_buffer *av1_init_read_bit_buffer(
    AV1Decoder *pbi, struct aom_read_bit_buffer *rb, const uint8_t *data,
    const uint8_t *data_end) {
  rb->bit_offset = 0;
  rb->error_handler = error_handler;
  rb->error_handler_data = &pbi->common;
  rb->bit_buffer = data;
  rb->bit_buffer_end = data_end;
  return rb;
}